

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

deThread deThread_create(deThreadFunc func,void *arg,deThreadAttributes *attributes)

{
  int iVar1;
  deThreadFunc __newthread;
  Thread *thread;
  pthread_attr_t attr;
  deThreadAttributes *attributes_local;
  void *arg_local;
  deThreadFunc func_local;
  
  attr._48_8_ = attributes;
  attributes_local = (deThreadAttributes *)arg;
  arg_local = func;
  __newthread = (deThreadFunc)deCalloc(0x18);
  if (__newthread == (deThreadFunc)0x0) {
    func_local = (deThreadFunc)0x0;
  }
  else {
    *(void **)(__newthread + 8) = arg_local;
    *(deThreadAttributes **)(__newthread + 0x10) = attributes_local;
    iVar1 = pthread_attr_init((pthread_attr_t *)&thread);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setdetachstate((pthread_attr_t *)&thread,0);
      if (iVar1 == 0) {
        iVar1 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)&thread,startThread,
                               __newthread);
        if (iVar1 == 0) {
          pthread_attr_destroy((pthread_attr_t *)&thread);
          func_local = __newthread;
        }
        else {
          pthread_attr_destroy((pthread_attr_t *)&thread);
          deFree(__newthread);
          func_local = (deThreadFunc)0x0;
        }
      }
      else {
        pthread_attr_destroy((pthread_attr_t *)&thread);
        deFree(__newthread);
        func_local = (deThreadFunc)0x0;
      }
    }
    else {
      deFree(__newthread);
      func_local = (deThreadFunc)0x0;
    }
  }
  return (deThread)func_local;
}

Assistant:

deThread deThread_create (deThreadFunc func, void* arg, const deThreadAttributes* attributes)
{
	pthread_attr_t	attr;
	Thread*			thread	= (Thread*)deCalloc(sizeof(Thread));

	if (!thread)
		return 0;

	thread->func	= func;
	thread->arg		= arg;

	if (pthread_attr_init(&attr) != 0)
	{
		deFree(thread);
		return 0;
	}

	/* \todo [2009-11-12 pyry] Map attributes. */
	DE_UNREF(attributes);

	if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE) != 0)
	{
		pthread_attr_destroy(&attr);
		deFree(thread);
		return 0;
	}

	if (pthread_create(&thread->thread, &attr, startThread, thread) != 0)
	{
		pthread_attr_destroy(&attr);
		deFree(thread);
		return 0;
	}
	DE_ASSERT(thread->thread);

	pthread_attr_destroy(&attr);

	return (deThread)thread;
}